

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitBinExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType type;
  WasmType expectedType;
  WasmRegisterSpace *this_00;
  EmitInfo EVar1;
  undefined6 in_register_00000032;
  EmitInfo local_48;
  EmitInfo rhs;
  EmitInfo lhs;
  
  type = *signature;
  expectedType = signature[1];
  local_48 = PopEvalStack(this,signature[2],(char16 *)0x0);
  rhs = PopEvalStack(this,expectedType,(char16 *)0x0);
  ReleaseLocation(this,&local_48);
  ReleaseLocation(this,&rhs);
  this_00 = GetRegisterSpace(this,type);
  EVar1.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x10])
            (this->m_writer,CONCAT62(in_register_00000032,op) & 0xffffffff,
             (ulong)EVar1.super_EmitInfoBase.location,(ulong)rhs & 0xffffffff,
             (ulong)local_48 & 0xffffffff);
  EVar1.type = type;
  return EVar1;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitBinExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType lhsType = signature[1];
    WasmTypes::WasmType rhsType = signature[2];

    EmitInfo rhs = PopEvalStack(rhsType);
    EmitInfo lhs = PopEvalStack(lhsType);

    ReleaseLocation(&rhs);
    ReleaseLocation(&lhs);

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();

    m_writer->AsmReg3(op, resultReg, lhs.location, rhs.location);

    return EmitInfo(resultReg, resultType);
}